

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_5x5_int8.h
# Opt level: O0

void ncnn::conv5x5s1_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_R9;
  int stride_h;
  int stride_w;
  int kernel_h;
  int kernel_w;
  int in_stack_000007c4;
  int in_stack_000007c8;
  int in_stack_000007cc;
  Mat *in_stack_000007d0;
  Mat *in_stack_000007d8;
  Mat *in_stack_000007e0;
  int in_stack_000007f0;
  Mat *in_stack_000007f8;
  vector<float,_std::allocator<float>_> *in_stack_00000800;
  Option *in_stack_00000808;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x500000005,in_RDX);
  conv_im2col_sgemm_int8_dequant_sse
            (in_stack_000007e0,in_stack_000007d8,in_stack_000007d0,in_stack_000007cc,
             in_stack_000007c8,in_stack_000007c4,in_stack_000007f0,in_stack_000007f8,
             in_stack_00000800,in_stack_00000808);
  std::vector<float,_std::allocator<float>_>::~vector(in_R9);
  return;
}

Assistant:

static void conv5x5s1_int8_dequant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_dequant, const Option& opt)
{
    int kernel_w = 5;
    int kernel_h = 5;

    int stride_w = 1;
    int stride_h = 1;

    conv_im2col_sgemm_int8_dequant_sse(bottom_blob, top_blob, _kernel, kernel_w, kernel_h, stride_w, stride_h, _bias, scales_dequant, opt);
}